

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O2

void test_random_read_write<(coro_io::execution_type)2>(string_view filename)

{
  undefined1 auVar1 [16];
  string_view filepath;
  uint uVar2;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *pEVar3;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_00;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_01;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_02;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view buf_00;
  string buf1;
  undefined1 local_1c0 [8];
  string_view filename_local;
  pair<std::error_code,_unsigned_long> pair;
  undefined1 local_190 [24];
  basic_random_coro_file<(coro_io::execution_type)2> file1;
  string buf2;
  basic_random_coro_file<(coro_io::execution_type)2> file;
  char buf [100];
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_04;
  
  filename_local._M_str = filename._M_str;
  filename_local._M_len = filename._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&file,&filename_local,(allocator<char> *)buf);
  __l._M_len = 1;
  __l._M_array = (iterator)&file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&file1,__l,(allocator_type *)&buf1);
  create_files((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&file1,0xbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&file1);
  std::__cxx11::string::~string((string *)&file);
  filepath._M_str = filename_local._M_str;
  filepath._M_len = filename_local._M_len;
  uVar2 = std::thread::hardware_concurrency();
  pEVar3 = coro_io::get_global_block_executor<coro_io::io_context_pool>(uVar2);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::basic_random_coro_file
            (&file,filepath,_S_in,pEVar3);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&file;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)&file1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&file;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)&file1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            (&file1,(uint64_t)&file,(char *)0x0,(size_t)buf);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            (&pair,(coro *)&file1,lazy);
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)&file1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)buf;
  file1.executor_wrapper_.super_Executor._name._M_dataplus._M_p = (pointer)&pair;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_16_2_20c0d53e::operator()
            ((anon_class_16_2_20c0d53e *)&file1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&file;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)&file1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)&buf1,(uint64_t)&file,(char *)0xa
             ,(size_t)buf);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)&file1,(coro *)&buf1,lazy_00);
  pair.first._0_8_ = file1.executor_wrapper_.super_Executor._vptr_Executor;
  pair.first._M_cat =
       (error_category *)file1.executor_wrapper_.super_Executor._name._M_dataplus._M_p;
  pair.second = file1.executor_wrapper_.super_Executor._name._M_string_length;
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)&buf1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&file;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)&file1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&pair;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)&file1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)&buf1,(uint64_t)&file,
             (char *)0x6e,(size_t)buf);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)&file1,(coro *)&buf1,lazy_01);
  pair.first._0_8_ = file1.executor_wrapper_.super_Executor._vptr_Executor;
  pair.first._M_cat =
       (error_category *)file1.executor_wrapper_.super_Executor._name._M_dataplus._M_p;
  pair.second = file1.executor_wrapper_.super_Executor._name._M_string_length;
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)&buf1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&pair;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)&file1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)&buf1,(uint64_t)&file,
             (char *)0xc8,(size_t)buf);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)&file1,(coro *)&buf1,lazy_02);
  pair.first._0_8_ = file1.executor_wrapper_.super_Executor._vptr_Executor;
  pair.first._M_cat =
       (error_category *)file1.executor_wrapper_.super_Executor._name._M_dataplus._M_p;
  pair.second = file1.executor_wrapper_.super_Executor._name._M_string_length;
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)&buf1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&file;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)&file1);
  file1.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&pair;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)&file1);
  uVar2 = std::thread::hardware_concurrency();
  pEVar3 = coro_io::get_global_block_executor<coro_io::io_context_pool>(uVar2);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::basic_random_coro_file(&file1,pEVar3)
  ;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open
            (&file1,(char *)filename_local._M_len,(int)filename_local._M_str,0x10);
  buf1._M_dataplus._M_p = (pointer)&file1;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_a7e8a955::operator()
            ((anon_class_8_1_a7e8a955 *)&buf1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf1,"cccccccccc",(allocator<char> *)&buf2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = buf1._M_string_length;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_190,(uint64_t)&file1,
             (string_view)(auVar1 << 0x40));
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)&buf2,(coro *)local_190,lazy_03);
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf2,"dddddddddd",(allocator<char> *)local_190);
  buf_00._M_str = (char *)buf2._M_string_length;
  buf_00._M_len = 10;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_1c0,(uint64_t)&file1,buf_00
            );
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)local_190,(coro *)local_1c0,lazy_04);
  async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::~LazyBase
            ((LazyBase<std::pair<std::error_code,_unsigned_long>,_false> *)local_1c0);
  std::__cxx11::string::~string((string *)&buf2);
  std::__cxx11::string::~string((string *)&buf1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file(&file1);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file(&file);
  return;
}

Assistant:

void test_random_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_random_coro_file<execute_type> file(filename, std::ios::in);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif

  char buf[100];
  auto pair = async_simple::coro::syncAwait(file.async_read_at(0, buf, 10));
  CHECK(std::string_view(buf, pair.second) == "AAAAAAAAAA");
  CHECK(!file.eof());

  pair = async_simple::coro::syncAwait(file.async_read_at(10, buf, 100));
  CHECK(!file.eof());
  CHECK(pair.second == 100);

  pair = async_simple::coro::syncAwait(file.async_read_at(110, buf, 100));
  CHECK(pair.second == 80);

  // only read size equal 0 is eof.
  pair = async_simple::coro::syncAwait(file.async_read_at(200, buf, 100));
  CHECK(file.eof());
  CHECK(pair.second == 0);

  coro_io::basic_random_coro_file<execute_type> file1;
  file1.open(filename, std::ios::out);
  CHECK(file1.is_open());
  std::string buf1 = "cccccccccc";
  async_simple::coro::syncAwait(file1.async_write_at(0, buf1));

  std::string buf2 = "dddddddddd";
  async_simple::coro::syncAwait(file1.async_write_at(10, buf2));
}